

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void write_layer_weights(void)

{
  char *pcVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  string file_name;
  vector<double,_std::allocator<double>_> weights;
  ofstream fout_weights;
  char *local_280;
  undefined8 local_270;
  undefined8 uStack_268;
  string local_260;
  void *local_240;
  long local_238;
  ulong *local_228;
  long local_220;
  ulong local_218 [29];
  ios_base local_130 [264];
  
  calculate_global_layer_weights();
  if (mpi_rank != 0) goto LAB_0011b1ff;
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,data_folder_abi_cxx11_._M_dataplus._M_p,
             data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&local_228);
  OutputIterations::get_current_iteration_string_abi_cxx11_(&local_260,&output_iterations);
  uVar6 = 0xf;
  if (local_228 != local_218) {
    uVar6 = local_218[0];
  }
  if (uVar6 < local_260._M_string_length + local_220) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      uVar4 = local_260.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar4 < local_260._M_string_length + local_220) goto LAB_0011b0cf;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_228);
  }
  else {
LAB_0011b0cf:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_260._M_dataplus._M_p);
  }
  local_280 = (char *)&local_270;
  pcVar1 = (char *)(puVar2 + 2);
  if ((char *)*puVar2 == pcVar1) {
    local_270 = *(undefined8 *)pcVar1;
    uStack_268 = puVar2[3];
  }
  else {
    local_270 = *(undefined8 *)pcVar1;
    local_280 = (char *)*puVar2;
  }
  *puVar2 = pcVar1;
  puVar2[1] = 0;
  *pcVar1 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  std::ofstream::ofstream(&local_228,local_280,_S_out);
  uVar5 = (uint)((ulong)(local_238 - (long)local_240) >> 3);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      poVar3 = std::ostream::_M_insert<double>(*(double *)((long)local_240 + uVar6 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  local_228 = _VTT;
  *(undefined8 *)((long)&local_228 + _VTT[-3]) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_220);
  std::ios_base::~ios_base(local_130);
  if (local_280 != (char *)&local_270) {
    operator_delete(local_280);
  }
LAB_0011b1ff:
  if (local_240 != (void *)0x0) {
    operator_delete(local_240);
  }
  return;
}

Assistant:

void write_layer_weights() {
    auto weights = calculate_global_layer_weights();

    if (mpi_rank == 0) {
        const std::string file_name = data_folder + "/weights" + output_iterations.get_current_iteration_string();

        ofstream fout_weights(file_name.c_str(), ios_base::out);

        int length = weights.size();
        for (int i = 0; i < length; i++) {
            fout_weights << weights[i] << "\n";
        }
    }
}